

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FieldDescriptorProto::ByteSizeLong(FieldDescriptorProto *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar1 == '\0') {
    sVar3 = 0;
  }
  else {
    if ((uVar1 & 1) == 0) {
      sVar3 = 0;
    }
    else {
      sVar3 = internal::WireFormatLite::StringSize((this->name_).ptr_);
      sVar3 = sVar3 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->extendee_).ptr_);
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->type_name_).ptr_);
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 8) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->default_value_).ptr_);
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar2 = internal::WireFormatLite::StringSize((this->json_name_).ptr_);
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::FieldOptions>(this->options_);
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 & 0x40) != 0) {
      sVar2 = io::CodedOutputStream::VarintSize32SignExtended(this->number_);
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((char)uVar1 < '\0') {
      sVar2 = io::CodedOutputStream::VarintSize32SignExtended(this->oneof_index_);
      sVar3 = sVar3 + sVar2 + 1;
    }
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      sVar2 = io::CodedOutputStream::VarintSize32SignExtended(this->label_);
      sVar3 = sVar3 + sVar2 + 1;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      sVar2 = io::CodedOutputStream::VarintSize32SignExtended(this->type_);
      sVar3 = sVar3 + sVar2 + 1;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar3;
    return sVar3;
  }
  sVar3 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar3,&this->_cached_size_);
  return sVar3;
}

Assistant:

size_t FieldDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string extendee = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_extendee());
    }

    // optional string type_name = 6;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_type_name());
    }

    // optional string default_value = 7;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_default_value());
    }

    // optional string json_name = 10;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_json_name());
    }

    // optional .google.protobuf.FieldOptions options = 8;
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional int32 number = 3;
    if (cached_has_bits & 0x00000040u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_number());
    }

    // optional int32 oneof_index = 9;
    if (cached_has_bits & 0x00000080u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_oneof_index());
    }

  }
  if (cached_has_bits & 0x00000300u) {
    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if (cached_has_bits & 0x00000100u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_label());
    }

    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if (cached_has_bits & 0x00000200u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_type());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}